

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O1

void Omega_h::vtk::read_pvtu
               (path *pvtupath,CommPtr *comm,I32 *npieces_out,path *vtupath_out,
               Int *nghost_layers_out)

{
  char cVar1;
  value_type *pvVar2;
  string vtupath;
  path parentpath;
  ifstream stream;
  CommPtr local_2c8;
  string local_2b8;
  path local_298;
  path local_278;
  path local_258;
  istream local_238 [520];
  
  filesystem::path::parent_path(&local_278,pvtupath);
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  pvVar2 = filesystem::path::c_str(pvtupath);
  std::ifstream::ifstream(local_238,pvVar2,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    read_pvtu(local_238,&local_2c8,npieces_out,&local_2b8,nghost_layers_out);
    if (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2c8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    filesystem::path::path(&local_298,&local_2b8);
    filesystem::operator/(&local_258,&local_278,&local_298);
    std::__cxx11::string::operator=((string *)vtupath_out,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.impl._M_dataplus._M_p != &local_258.impl.field_2) {
      operator_delete(local_258.impl._M_dataplus._M_p,
                      local_258.impl.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.impl._M_dataplus._M_p != &local_298.impl.field_2) {
      operator_delete(local_298.impl._M_dataplus._M_p,
                      local_298.impl.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                               local_2b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.impl._M_dataplus._M_p != &local_278.impl.field_2) {
      operator_delete(local_278.impl._M_dataplus._M_p,
                      local_278.impl.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pvVar2 = filesystem::path::c_str(pvtupath);
  fail("couldn\'t open \"%s\"\n",pvVar2);
}

Assistant:

void read_pvtu(filesystem::path const& pvtupath, CommPtr comm, I32* npieces_out,
    filesystem::path* vtupath_out, Int* nghost_layers_out) {
  auto parentpath = pvtupath.parent_path();
  std::string vtupath;
  std::ifstream stream(pvtupath.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", pvtupath.c_str());
  }
  read_pvtu(stream, comm, npieces_out, &vtupath, nghost_layers_out);
  *vtupath_out = parentpath / vtupath;
}